

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_modifiedStrings_Test::TestBody(stringToUnits_modifiedStrings_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  precise_unit pVar4;
  AssertHelper local_358;
  Message local_350;
  allocator local_341;
  string local_340;
  precise_unit local_320;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_7;
  string local_2f8;
  undefined1 local_2d8 [8];
  precise_unit u8;
  Message local_2c0;
  precise_unit local_2b8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  string local_290;
  undefined1 local_270 [8];
  precise_unit u7;
  Message local_258;
  precise_unit local_250;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_5;
  string local_228;
  undefined1 local_208 [8];
  precise_unit u6;
  Message local_1f0;
  precise_unit local_1e8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  string local_1c0;
  undefined1 local_1a0 [8];
  precise_unit u5;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  string local_168;
  undefined1 local_148 [8];
  precise_unit u4;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  string local_110;
  undefined1 local_f0 [8];
  precise_unit u3;
  Message local_d8;
  precise_unit local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a8;
  undefined1 local_88 [8];
  precise_unit u2;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit u1;
  stringToUnits_modifiedStrings_Test *this_local;
  
  u1._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"linear yard",&local_41);
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_40,uVar2);
  u1.multiplier_ = pVar4._8_8_;
  local_20 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  units::precise_unit::commodity((precise_unit *)local_20,0);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_68,"u1","precise::yd",(precise_unit *)local_20,
             (precise_unit *)units::precise::yd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u2.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u2.base_units_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u2.base_units_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"kilogram per millimetre",
             (allocator *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_a8,uVar2);
  u2.multiplier_ = pVar4._8_8_;
  local_88 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_d0 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::kg,(precise_unit *)units::precise::mm);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c0,"u2","precise::kg / precise::mm",(precise_unit *)local_88,
             &local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u3.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u3.base_units_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u3.base_units_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"British thermal unit (59 degF)",
             (allocator *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_110,uVar2);
  u3.multiplier_ = pVar4._8_8_;
  local_f0 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_128,"u3","precise::energy::btu_59",(precise_unit *)local_f0,
             (precise_unit *)units::precise::energy::btu_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u4.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4ec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u4.base_units_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u4.base_units_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"calorie (20 degC)",
             (allocator *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_168,uVar2);
  u4.multiplier_ = pVar4._8_8_;
  local_148 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_180,"u4","precise::energy::cal_20",(precise_unit *)local_148,
             (precise_unit *)units::precise::energy::cal_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u5.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u5.base_units_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u5.base_units_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"nanometre",
             (allocator *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_1c0,uVar2);
  u5.multiplier_ = pVar4._8_8_;
  local_1a0 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1e8 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::nano,(precise_unit *)units::precise::m);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1d8,"u5","precise::nano * precise::m",(precise_unit *)local_1a0,
             &local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u6.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u6.base_units_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u6.base_units_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"ton (US) per hour",
             (allocator *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_228,uVar2);
  u6.multiplier_ = pVar4._8_8_;
  local_208 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_250 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::ton,(precise_unit *)units::precise::hr);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_240,"u6","precise::ton / precise::hr",(precise_unit *)local_208,
             &local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u7.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u7.base_units_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u7.base_units_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,"foot of water(39.2 degF)",
             (allocator *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_290,uVar2);
  u7.multiplier_ = pVar4._8_8_;
  local_270 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  units::precise_unit::precise_unit(&local_2b8,2988.984,(unit *)&units::Pa);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_2a8,"u7","precise_unit(2988.98400, Pa)",(precise_unit *)local_270,
             &local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u8.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u8.base_units_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u8.base_units_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f8,"[qt_us]",
             (allocator *)
             ((long)&gtest_ar_7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_2f8,uVar2);
  u8.multiplier_ = pVar4._8_8_;
  local_2d8 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"[QT_US]",&local_341);
  uVar2 = units::getDefaultFlags();
  local_320 = units::unit_from_string(&local_340,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_310,"u8","unit_from_string(\"[QT_US]\")",(precise_unit *)local_2d8,
             &local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4fb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  return;
}

Assistant:

TEST(stringToUnits, modifiedStrings)
{
    auto u1 = unit_from_string("linear yard");
    u1.commodity(0);
    EXPECT_EQ(u1, precise::yd);

    auto u2 = unit_from_string("kilogram per millimetre");
    EXPECT_EQ(u2, precise::kg / precise::mm);

    auto u3 = unit_from_string("British thermal unit (59 degF)");
    EXPECT_EQ(u3, precise::energy::btu_59);

    auto u4 = unit_from_string("calorie (20 degC)");
    EXPECT_EQ(u4, precise::energy::cal_20);

    auto u5 = unit_from_string("nanometre");
    EXPECT_EQ(u5, precise::nano * precise::m);

    auto u6 = unit_from_string("ton (US) per hour");
    EXPECT_EQ(u6, precise::ton / precise::hr);

    auto u7 = unit_from_string("foot of water(39.2 degF)");
    EXPECT_EQ(u7, precise_unit(2988.98400, Pa));

    auto u8 = unit_from_string("[qt_us]");
    EXPECT_EQ(u8, unit_from_string("[QT_US]"));
}